

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O2

sc_string_old __thiscall sc_dt::sc_string_old::operator+(sc_string_old *this,sc_string_old *s)

{
  int iVar1;
  int iVar2;
  sc_string_rep *this_00;
  sc_string_old *in_RDX;
  
  iVar1 = length(s);
  this_00 = (sc_string_rep *)operator_new(0x10);
  iVar2 = length(in_RDX);
  sc_string_rep::sc_string_rep(this_00,iVar1 + iVar2 + 1);
  strcpy(this_00->str,s->rep->str);
  strcpy(this_00->str + iVar1,in_RDX->rep->str);
  sc_string_old(this,this_00);
  return (sc_string_old)(sc_string_rep *)this;
}

Assistant:

sc_string_old
sc_string_old::operator+( const sc_string_old& s ) const
{
    int len = length();
    sc_string_rep* r = new sc_string_rep( len + s.length() + 1 );
    strcpy( r->str, rep->str );
    strcpy( r->str + len, s.rep->str );
    return sc_string_old(r);
}